

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DequoteNumber(Parse *pParse,Expr *p)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  long in_FS_OFFSET;
  bool bVar5;
  int iValue;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p != (Expr *)0x0) {
    pbVar3 = (byte *)(p->u).zToken;
    if (*pbVar3 == 0x30) {
      bVar5 = (pbVar3[1] & 0xdf) == 0x58;
    }
    else {
      bVar5 = false;
    }
    local_3c = -0x55555556;
    p->op = 0x9c;
    pbVar4 = pbVar3;
    do {
      if (*pbVar3 == 0x5f) {
        if (bVar5) {
          if (((""[pbVar3[-1]] & 8) == 0) || ((""[pbVar3[1]] & 8) == 0)) {
LAB_00177d2f:
            sqlite3ErrorMsg(pParse,"unrecognized token: \"%s\"",(p->u).zToken);
          }
        }
        else if (((ulong)pbVar3[-1] - 0x3a < 0xfffffffffffffff6) ||
                ((ulong)pbVar3[1] - 0x3a < 0xfffffffffffffff6)) goto LAB_00177d2f;
      }
      else {
        *pbVar4 = *pbVar3;
        pbVar4 = pbVar4 + 1;
        if ((*pbVar3 - 0x2e < 0x38) &&
           ((0x80000000800001U >> ((ulong)(*pbVar3 - 0x2e) & 0x3f) & 1) != 0)) {
          p->op = 0x9a;
        }
      }
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
    if (bVar5) {
      p->op = 0x9c;
    }
    if ((p->op == 0x9c) && (iVar2 = sqlite3GetInt32((p->u).zToken,&local_3c), iVar2 != 0)) {
      (p->u).iValue = local_3c;
      pbVar3 = (byte *)((long)&p->flags + 1);
      *pbVar3 = *pbVar3 | 8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3DequoteNumber(Parse *pParse, Expr *p){
  assert( p!=0 || pParse->db->mallocFailed );
  if( p ){
    const char *pIn = p->u.zToken;
    char *pOut = p->u.zToken;
    int bHex = (pIn[0]=='0' && (pIn[1]=='x' || pIn[1]=='X'));
    int iValue;
    assert( p->op==TK_QNUMBER );
    p->op = TK_INTEGER;
    do {
      if( *pIn!=SQLITE_DIGIT_SEPARATOR ){
        *pOut++ = *pIn;
        if( *pIn=='e' || *pIn=='E' || *pIn=='.' ) p->op = TK_FLOAT;
      }else{
        if( (bHex==0 && (!sqlite3Isdigit(pIn[-1]) || !sqlite3Isdigit(pIn[1])))
         || (bHex==1 && (!sqlite3Isxdigit(pIn[-1]) || !sqlite3Isxdigit(pIn[1])))
        ){
          sqlite3ErrorMsg(pParse, "unrecognized token: \"%s\"", p->u.zToken);
        }
      }
    }while( *pIn++ );
    if( bHex ) p->op = TK_INTEGER;

    /* tag-20240227-a: If after dequoting, the number is an integer that
    ** fits in 32 bits, then it must be converted into EP_IntValue.  Other
    ** parts of the code expect this.  See also tag-20240227-b. */
    if( p->op==TK_INTEGER && sqlite3GetInt32(p->u.zToken, &iValue) ){
      p->u.iValue = iValue;
      p->flags |= EP_IntValue;
    }
  }
}